

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

void __thiscall
helics::Endpoint::Endpoint
          (Endpoint *this,MessageFederate *mFed,string_view name,InterfaceHandle hid)

{
  Federate *federate;
  
  if (mFed == (MessageFederate *)0x0) {
    federate = (Federate *)0x0;
  }
  else {
    federate = (Federate *)
               ((long)&mFed->_vptr_MessageFederate + (long)mFed->_vptr_MessageFederate[-3]);
  }
  Interface::Interface(&this->super_Interface,federate,hid,name);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Endpoint_004caf08;
  this->fed = mFed;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->disableAssign = false;
  this->receiveOnly = false;
  (this->defDest)._M_dataplus._M_p = (pointer)&(this->defDest).field_2;
  (this->defDest)._M_string_length = 0;
  (this->defDest).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, InterfaceHandle hid):
    Interface(mFed, hid, name), fed(mFed)
{
}